

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mandelbrot_async.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  __tuple_element_t<4UL,_tuple<ImageSize,_Section,_int,_int,_basic_string<char,_char_traits<char>,_allocator<char>_>,_basic_string<char,_char_traits<char>,_allocator<char>_>,_int>_>
  *filename_00;
  __tuple_element_t<5UL,_tuple<ImageSize,_Section,_int,_int,_basic_string<char,_char_traits<char>,_allocator<char>_>,_basic_string<char,_char_traits<char>,_allocator<char>_>,_int>_>
  *filename_01;
  __tuple_element_t<0UL,_tuple<vector<PixelColor,_allocator<PixelColor>_>,_vector<double,_allocator<double>_>_>_>
  *image_data_00;
  __tuple_element_t<1UL,_tuple<vector<PixelColor,_allocator<PixelColor>_>,_vector<double,_allocator<double>_>_>_>
  *durations_00;
  type *durations;
  type *image_data;
  undefined1 local_d8 [8];
  Gradient gradient;
  type_conflict1 *num_threads;
  type *filename;
  type *gradient_filename;
  type_conflict1 *repetitions;
  type_conflict1 *max_iterations;
  type *section;
  type *image;
  char **local_18;
  char **argv_local;
  int argc_local;
  
  local_18 = argv;
  argv_local._4_4_ = argc;
  eval_args_abi_cxx11_
            ((tuple<ImageSize,_Section,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
              *)&image,argc,argv);
  std::get<0ul,ImageSize,Section,int,int,std::__cxx11::string,std::__cxx11::string,int>
            ((tuple<ImageSize,_Section,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
              *)&image);
  std::get<1ul,ImageSize,Section,int,int,std::__cxx11::string,std::__cxx11::string,int>
            ((tuple<ImageSize,_Section,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
              *)&image);
  std::get<2ul,ImageSize,Section,int,int,std::__cxx11::string,std::__cxx11::string,int>
            ((tuple<ImageSize,_Section,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
              *)&image);
  std::get<3ul,ImageSize,Section,int,int,std::__cxx11::string,std::__cxx11::string,int>
            ((tuple<ImageSize,_Section,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
              *)&image);
  filename_00 = std::
                get<4ul,ImageSize,Section,int,int,std::__cxx11::string,std::__cxx11::string,int>
                          ((tuple<ImageSize,_Section,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                            *)&image);
  filename_01 = std::
                get<5ul,ImageSize,Section,int,int,std::__cxx11::string,std::__cxx11::string,int>
                          ((tuple<ImageSize,_Section,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                            *)&image);
  gradient.colors.super__Vector_base<GradientColor,_std::allocator<GradientColor>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                get<6ul,ImageSize,Section,int,int,std::__cxx11::string,std::__cxx11::string,int>
                          ((tuple<ImageSize,_Section,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                            *)&image);
  load_gradient((Gradient *)local_d8,filename_00);
  go();
  image_data_00 =
       std::
       get<0ul,std::vector<PixelColor,std::allocator<PixelColor>>,std::vector<double,std::allocator<double>>>
                 ((tuple<std::vector<PixelColor,_std::allocator<PixelColor>_>,_std::vector<double,_std::allocator<double>_>_>
                   *)&image_data);
  durations_00 = std::
                 get<1ul,std::vector<PixelColor,std::allocator<PixelColor>>,std::vector<double,std::allocator<double>>>
                           ((tuple<std::vector<PixelColor,_std::allocator<PixelColor>_>,_std::vector<double,_std::allocator<double>_>_>
                             *)&image_data);
  save_image(filename_01,image_data_00);
  show_summary(durations_00);
  std::
  tuple<std::vector<PixelColor,_std::allocator<PixelColor>_>,_std::vector<double,_std::allocator<double>_>_>
  ::~tuple((tuple<std::vector<PixelColor,_std::allocator<PixelColor>_>,_std::vector<double,_std::allocator<double>_>_>
            *)&image_data);
  Gradient::~Gradient((Gradient *)local_d8);
  std::
  tuple<ImageSize,_Section,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  ::~tuple((tuple<ImageSize,_Section,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
            *)&image);
  return 0;
}

Assistant:

int main(int argc, char const* argv[])
{
    auto [image, section, max_iterations, repetitions, gradient_filename, filename, num_threads] = eval_args(argc, argv);
    auto gradient = load_gradient(gradient_filename);

    auto [image_data, durations] = go(image, section, max_iterations, gradient, repetitions, num_threads);

    save_image(filename, image_data);
    show_summary(durations);
}